

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

bool __thiscall wasm::DataFlow::Node::operator==(Node *this,Node *other)

{
  pointer ppNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this->type == other->type) {
    switch(this->type) {
    case Var:
    case Block:
      return this == other;
    case Expr:
      bVar6 = ExpressionAnalyzer::equal((this->field_1).expr,(other->field_1).expr);
      if (!bVar6) {
        return false;
      }
      break;
    case Cond:
      if ((this->field_1).index != (other->field_1).index) {
        return false;
      }
    }
    if ((long)(this->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(other->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(other->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      ppNVar1 = (this->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar6 = (this->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == ppNVar1;
      if (bVar6) {
        return bVar6;
      }
      bVar2 = operator==(*ppNVar1,*(other->values).
                                   super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      if (bVar2) {
        uVar3 = 1;
        do {
          uVar5 = (ulong)uVar3;
          ppNVar1 = (this->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = (long)(this->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3;
          if (uVar4 <= uVar5) {
            return uVar4 <= uVar5;
          }
          bVar6 = operator==(ppNVar1[uVar5],
                             (other->values).
                             super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar3 = uVar3 + 1;
        } while (bVar6);
        return uVar4 <= uVar5;
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool operator==(const Node& other) {
    if (type != other.type) {
      return false;
    }
    switch (type) {
      case Var:
      case Block:
        return this == &other;
      case Expr: {
        if (!ExpressionAnalyzer::equal(expr, other.expr)) {
          return false;
        }
        break;
      }
      case Cond: {
        if (index != other.index) {
          return false;
        }
        break;
      }
      default: {}
    }
    if (values.size() != other.values.size()) {
      return false;
    }
    for (Index i = 0; i < values.size(); i++) {
      if (*(values[i]) != *(other.values[i])) {
        return false;
      }
    }
    return true;
  }